

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateStubMethods
          (ServiceGenerator *this,Printer *printer)

{
  long lVar1;
  ServiceDescriptor *pSVar2;
  long lVar3;
  Formatter format;
  int local_6c;
  Formatter local_68;
  
  local_6c = 0;
  pSVar2 = this->descriptor_;
  if (0 < *(int *)(pSVar2 + 0x28)) {
    do {
      lVar3 = (long)local_6c;
      lVar1 = *(long *)(pSVar2 + 0x20);
      local_68.printer_ = printer;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_68.vars_._M_t,&(this->vars_)._M_t);
      anon_unknown_3::InitMethodVariables
                ((MethodDescriptor *)(lVar3 * 0x68 + lVar1),this->options_,&local_68);
      Formatter::operator()
                (&local_68,
                 "void $classname$_Stub::$name$(::$proto_ns$::RpcController* controller,\n                              const $input_type$* request,\n                              $output_type$* response,\n                              ::google::protobuf::Closure* done) {\n  channel_->CallMethod(descriptor()->method($1$),\n                       controller, request, response, done);\n}\n"
                 ,&local_6c);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_68.vars_._M_t);
      local_6c = local_6c + 1;
      pSVar2 = this->descriptor_;
    } while (local_6c < *(int *)(pSVar2 + 0x28));
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateStubMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    Formatter format(printer, vars_);
    InitMethodVariables(method, options_, &format);
    format(
        "void $classname$_Stub::$name$(::$proto_ns$::RpcController* "
        "controller,\n"
        "                              const $input_type$* request,\n"
        "                              $output_type$* response,\n"
        "                              ::google::protobuf::Closure* done) {\n"
        "  channel_->CallMethod(descriptor()->method($1$),\n"
        "                       controller, request, response, done);\n"
        "}\n",
        i);
  }
}